

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxInWitness(void *handle,int net_type,char *tx_hex_string,uint32_t txin_index,
                     uint32_t stack_index,char **stack_data)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  ulong uVar4;
  ulong uVar5;
  bool is_bitcoin;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> witness_stack;
  TransactionContext tx;
  TxInReference ref;
  bool local_2b9;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_2b8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_2a0;
  ScriptWitness local_288;
  undefined1 local_268 [120];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1f0 [9];
  undefined1 local_108 [120];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_90 [4];
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar1) {
    local_268._0_8_ = "cfdcapi_transaction.cpp";
    local_268._8_4_ = 0xa09;
    local_268._16_8_ = "CfdGetTxInWitness";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_268,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_268._0_8_ = local_268 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_268);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (stack_data != (char **)0x0) {
    local_2b8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b9 = false;
    cfd::capi::ConvertNetType(net_type,&local_2b9);
    if (local_2b9 == true) {
      std::__cxx11::string::string((string *)local_108,tx_hex_string,(allocator *)&local_288);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)local_268,(string *)local_108);
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
      }
      cfd::core::Transaction::GetTxIn
                ((TxInReference *)local_108,(Transaction *)local_268,txin_index);
      local_288._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0086dc20;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_288.witness_stack_,local_90);
      cfd::core::ScriptWitness::GetWitness(&local_2a0,&local_288);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_2b8,&local_2a0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_2a0);
      local_288._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0086dc20;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_288.witness_stack_);
      cfd::core::AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_108);
      cfd::TransactionContext::~TransactionContext((TransactionContext *)local_268);
    }
    else {
      std::__cxx11::string::string((string *)local_268,tx_hex_string,(allocator *)&local_288);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_108,(string *)local_268);
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
      cfd::core::ConfidentialTransaction::GetTxIn
                ((ConfidentialTxInReference *)local_268,(ConfidentialTransaction *)local_108,
                 txin_index);
      local_288._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0086dc20;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_288.witness_stack_,local_1f0);
      cfd::core::ScriptWitness::GetWitness(&local_2a0,&local_288);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&local_2b8,&local_2a0);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_2a0);
      local_288._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_0086dc20;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                (&local_288.witness_stack_);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
                ((ConfidentialTxInReference *)local_268);
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                ((ConfidentialTransactionContext *)local_108);
    }
    uVar5 = ((long)local_2b8.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_2b8.
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar4 = (ulong)stack_index;
    if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
      cfd::core::ByteData::GetHex_abi_cxx11_
                ((string *)local_268,
                 local_2b8.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start + uVar4);
      pcVar2 = cfd::capi::CreateString((string *)local_268);
      *stack_data = pcVar2;
      if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
        operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_2b8);
      return 0;
    }
    local_268._0_8_ = "cfdcapi_transaction.cpp";
    local_268._8_4_ = 0xa28;
    local_268._16_8_ = "CfdGetTxInWitness";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_268,kCfdLogLevelWarning,"stackIndex is illegal.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_268._0_8_ = local_268 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_268,"Failed to parameter. stackIndex out of witness stack.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)local_268);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_268._0_8_ = "cfdcapi_transaction.cpp";
  local_268._8_4_ = 0xa0f;
  local_268._16_8_ = "CfdGetTxInWitness";
  cfd::core::logger::log<>((CfdSourceLocation *)local_268,kCfdLogLevelWarning,"stack data is null.")
  ;
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_268._0_8_ = local_268 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,"Failed to parameter. stack data is null.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_268);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInWitness(
    void* handle, int net_type, const char* tx_hex_string, uint32_t txin_index,
    uint32_t stack_index, char** stack_data) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (stack_data == nullptr) {
      warn(CFD_LOG_SOURCE, "stack data is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. stack data is null.");
    }

    std::vector<ByteData> witness_stack;
    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      const TxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      const ConfidentialTxInReference ref = tx.GetTxIn(txin_index);
      witness_stack = ref.GetScriptWitness().GetWitness();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (witness_stack.size() <= stack_index) {
      warn(CFD_LOG_SOURCE, "stackIndex is illegal.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. stackIndex out of witness stack.");
    }
    *stack_data = CreateString(witness_stack[stack_index].GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}